

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O3

sunrealtype IDASensWrmsNorm(IDAMem IDA_mem,N_Vector *xS,N_Vector *wS,int mask)

{
  long lVar1;
  sunrealtype sVar2;
  sunrealtype sVar3;
  
  if (mask == 0) {
    N_VWrmsNormVectorArray(IDA_mem->ida_Ns,xS,wS,IDA_mem->ida_cvals);
  }
  else {
    N_VWrmsNormMaskVectorArray();
  }
  sVar2 = *IDA_mem->ida_cvals;
  if (1 < (long)IDA_mem->ida_Ns) {
    lVar1 = 1;
    sVar3 = sVar2;
    do {
      sVar2 = IDA_mem->ida_cvals[lVar1];
      if (sVar2 <= sVar3) {
        sVar2 = sVar3;
      }
      lVar1 = lVar1 + 1;
      sVar3 = sVar2;
    } while (IDA_mem->ida_Ns != lVar1);
  }
  return sVar2;
}

Assistant:

sunrealtype IDASensWrmsNorm(IDAMem IDA_mem, N_Vector* xS, N_Vector* wS,
                            sunbooleantype mask)
{
  int is;
  sunrealtype nrm;

  if (mask)
  {
    (void)N_VWrmsNormMaskVectorArray(IDA_mem->ida_Ns, xS, wS, IDA_mem->ida_id,
                                     IDA_mem->ida_cvals);
  }
  else
  {
    (void)N_VWrmsNormVectorArray(IDA_mem->ida_Ns, xS, wS, IDA_mem->ida_cvals);
  }

  nrm = IDA_mem->ida_cvals[0];
  for (is = 1; is < IDA_mem->ida_Ns; is++)
  {
    if (IDA_mem->ida_cvals[is] > nrm) { nrm = IDA_mem->ida_cvals[is]; }
  }

  return (nrm);
}